

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

void __thiscall SVGChart::DummyData::DummyData(DummyData *this,long inSize)

{
  float local_20;
  int local_1c;
  long lStack_18;
  int theI;
  long inSize_local;
  DummyData *this_local;
  
  lStack_18 = inSize;
  inSize_local = (long)this;
  PlotDataBase::PlotDataBase(&this->super_PlotDataBase);
  (this->super_PlotDataBase)._vptr_PlotDataBase = (_func_int **)&PTR__DummyData_001245b0;
  std::vector<float,_std::allocator<float>_>::vector(&this->mRealPlotData);
  for (local_1c = 0; local_1c < lStack_18; local_1c = local_1c + 1) {
    local_20 = (float)local_1c;
    std::vector<float,_std::allocator<float>_>::push_back(&this->mRealPlotData,&local_20);
  }
  return;
}

Assistant:

DummyData::DummyData (long inSize) {
      for (int theI=0;theI<inSize;theI++) {
        mRealPlotData.push_back (theI);// simple ascending data
      }
    }